

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_extension_loader.cpp
# Opt level: O2

bool duckdb::TryLoadLinkedExtension(DuckDB *db,string *extension)

{
  bool bVar1;
  
  bVar1 = ::std::operator==(extension,"core_functions");
  if (bVar1) {
    DuckDB::LoadStaticExtension<duckdb::CoreFunctionsExtension>(db);
  }
  else {
    bVar1 = ::std::operator==(extension,"parquet");
    if (bVar1) {
      DuckDB::LoadStaticExtension<duckdb::ParquetExtension>(db);
    }
    else {
      bVar1 = ::std::operator==(extension,"jemalloc");
      if (!bVar1) {
        return false;
      }
      DuckDB::LoadStaticExtension<duckdb::JemallocExtension>(db);
    }
  }
  return true;
}

Assistant:

bool TryLoadLinkedExtension(DuckDB &db, const string &extension) {

  if (extension=="core_functions") {
      db.LoadStaticExtension<CoreFunctionsExtension>();
      return true;
  }
  if (extension=="parquet") {
      db.LoadStaticExtension<ParquetExtension>();
      return true;
  }
  if (extension=="jemalloc") {
      db.LoadStaticExtension<JemallocExtension>();
      return true;
  }

    return false;
}